

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INetwork.cpp
# Opt level: O3

void __thiscall
INetwork::AddNeuron(INetwork *this,INeuron *neuronPtr,size_t neuronId,NEURON_TYPE neuronType)

{
  _Rb_tree_header *p_Var1;
  pointer *pppIVar2;
  _Base_ptr p_Var3;
  mapped_type *ppIVar4;
  _Base_ptr p_Var5;
  vector<INeuron*,std::allocator<INeuron*>> *this_00;
  iterator __position;
  INeuron *local_28;
  size_t local_20;
  
  p_Var3 = (this->neuronMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var3 != (_Base_ptr)0x0) {
    p_Var1 = &(this->neuronMap)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = &p_Var1->_M_header;
    do {
      if (*(ulong *)(p_Var3 + 1) >= neuronId) {
        p_Var5 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[*(ulong *)(p_Var3 + 1) < neuronId];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 != p_Var1) && (*(ulong *)(p_Var5 + 1) <= neuronId)) {
      return;
    }
  }
  local_28 = neuronPtr;
  local_20 = neuronId;
  ppIVar4 = std::
            map<unsigned_long,_INeuron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_INeuron_*>_>_>
            ::operator[](&this->neuronMap,&local_20);
  *ppIVar4 = neuronPtr;
  if (neuronType == OUTPUT) {
    __position._M_current =
         (this->output).super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current !=
        (this->output).super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      *__position._M_current = neuronPtr;
      pppIVar2 = &(this->output).super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppIVar2 = *pppIVar2 + 1;
      return;
    }
    this_00 = (vector<INeuron*,std::allocator<INeuron*>> *)&this->output;
  }
  else {
    if (neuronType != INPUT) {
      return;
    }
    __position._M_current =
         (this->input).super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current !=
        (this->input).super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      *__position._M_current = neuronPtr;
      pppIVar2 = &(this->input).super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppIVar2 = *pppIVar2 + 1;
      return;
    }
    this_00 = (vector<INeuron*,std::allocator<INeuron*>> *)&this->input;
  }
  std::vector<INeuron*,std::allocator<INeuron*>>::_M_realloc_insert<INeuron*const&>
            (this_00,__position,&local_28);
  return;
}

Assistant:

void INetwork::AddNeuron( INeuron *neuronPtr, size_t neuronId, SPIKING_NN::NEURON_TYPE neuronType )
{
    if ( neuronMap.find( neuronId ) == neuronMap.end()) {
        neuronMap[neuronId] = neuronPtr;
        if ( neuronType == SPIKING_NN::NEURON_TYPE::INPUT ) {
            input.push_back( neuronPtr );
        } else if ( neuronType == SPIKING_NN::NEURON_TYPE::OUTPUT ) {
            output.push_back( neuronPtr );
        }
    }
}